

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSAXMLScanner.cpp
# Opt level: O0

bool __thiscall xercesc_4_0::XSAXMLScanner::scanStartTag(XSAXMLScanner *this,bool *gotData)

{
  SchemaElementDecl *this_00;
  XMLStringPool *pXVar1;
  RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher> *this_01;
  XMLValidator *pXVar2;
  XMLDocumentHandler *pXVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  GrammarType GVar9;
  XMLCh *pXVar10;
  XMLSize_t XVar11;
  StackElem *pSVar12;
  undefined4 extraout_var;
  XMLSize_t XVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar14;
  undefined4 extraout_var_02;
  XMLSize_t XVar15;
  QName *child;
  undefined4 extraout_var_03;
  Grammar *pGVar16;
  MemoryManager *in_stack_fffffffffffffdd8;
  ComplexTypeInfo *local_1b0;
  bool local_181;
  undefined1 local_128 [7];
  bool res;
  XMLSize_t failure;
  XMLBuffer *prefixBuf;
  XMLBufBid bbPrefix;
  int comma;
  XMLCh *typeName;
  ComplexTypeInfo *typeinfo;
  SchemaElementDecl *pSStack_e8;
  bool bXsiTypeSet;
  XMLElementDecl *elemDecl;
  XMLCh *nameRawBuf;
  bool wasAdded;
  undefined1 local_c8 [8];
  QName element;
  bool parentValidation;
  uint uriId;
  XMLSize_t elemDepth;
  ComplexTypeInfo *currType;
  ModelTypes modelType;
  SchemaElementDecl *tempElement;
  bool laxThisOne;
  XMLContentModel *pXStack_50;
  uint currentScope;
  XMLContentModel *cm;
  ContentLeafNameTypeVector *cv;
  XMLSize_t attCount;
  XMLCh *pXStack_30;
  bool isEmpty;
  XMLCh *qnameRawBuf;
  bool isRoot;
  bool *pbStack_20;
  int prefixColonPos;
  bool *gotData_local;
  XSAXMLScanner *this_local;
  
  *gotData = true;
  pbStack_20 = gotData;
  gotData_local = (bool *)this;
  XMLBuffer::reset(&(this->super_SGXMLScanner).fContent);
  bVar5 = ReaderMgr::getQName(&(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr,
                              &(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf,
                              (int *)((long)&qnameRawBuf + 4));
  if (bVar5) {
    qnameRawBuf._3_1_ = ElemStack::isEmpty(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
    ReaderMgr::skipPastSpaces(&(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr);
    pXStack_30 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf);
    XVar11 = SGXMLScanner::rawAttrScan
                       (&this->super_SGXMLScanner,pXStack_30,(this->super_SGXMLScanner).fRawAttrList
                        ,(bool *)((long)&attCount + 7));
    cm = (XMLContentModel *)0x0;
    pXStack_50 = (XMLContentModel *)0x0;
    tempElement._4_4_ = 0xfffffffe;
    tempElement._3_1_ = false;
    if ((qnameRawBuf._3_1_ & 1) == 0) {
      pSVar12 = ElemStack::topElement(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
      this_00 = (SchemaElementDecl *)pSVar12->fThisElement;
      currType._4_4_ = SchemaElementDecl::getModelType(this_00);
      if (((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) == 0) {
        elemDepth = (XMLSize_t)SchemaElementDecl::getComplexTypeInfo(this_00);
      }
      else {
        elemDepth = (XMLSize_t)
                    SchemaValidator::getCurrentTypeInfo
                              ((SchemaValidator *)
                               (this->super_SGXMLScanner).super_XMLScanner.fValidator);
        if ((ComplexTypeInfo *)elemDepth == (ComplexTypeInfo *)0x0) {
          currType._4_4_ = Any;
        }
        else {
          currType._4_4_ = ComplexTypeInfo::getContentType((ComplexTypeInfo *)elemDepth);
        }
      }
      if (((currType._4_4_ == Mixed_Simple) || (currType._4_4_ == Mixed_Complex)) ||
         (currType._4_4_ == Children)) {
        pXStack_50 = ComplexTypeInfo::getContentModel((ComplexTypeInfo *)elemDepth,false);
        iVar6 = (*pXStack_50->_vptr_XMLContentModel[5])();
        cm = (XMLContentModel *)CONCAT44(extraout_var,iVar6);
        tempElement._4_4_ =
             ElemStack::getCurrentScope(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
      }
      else {
        tempElement._3_1_ = currType._4_4_ == Any;
      }
    }
    XVar13 = ElemStack::addLevel(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
    ElemStack::setValidationFlag
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,
               (bool)((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1));
    ElemStack::setPrefixColonPos
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,qnameRawBuf._4_4_);
    if (XVar11 != 0) {
      scanRawAttrListforNameSpaces(this,XVar11);
    }
    element.fMemoryManager._4_4_ =
         XMLScanner::resolveQNameWithColon
                   ((XMLScanner *)this,pXStack_30,
                    &(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf,Mode_Element,
                    qnameRawBuf._4_4_);
    element.fMemoryManager._3_1_ = (this->super_SGXMLScanner).super_XMLScanner.fValidate & 1;
    if (cm != (XMLContentModel *)0x0) {
      pXVar10 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf);
      QName::QName((QName *)local_c8,pXVar10,pXStack_30 + (long)qnameRawBuf._4_4_ + 1,
                   element.fMemoryManager._4_4_,
                   (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
      tempElement._3_1_ =
           SGXMLScanner::laxElementValidation
                     (&this->super_SGXMLScanner,(QName *)local_c8,(ContentLeafNameTypeVector *)cm,
                      pXStack_50,XVar13 - 1);
      QName::~QName((QName *)local_c8);
    }
    bVar5 = false;
    pXVar10 = pXStack_30 + (qnameRawBuf._4_4_ + 1);
    pGVar16 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
    iVar6 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[0xb])
                      (pGVar16,(ulong)element.fMemoryManager._4_4_,pXVar10,pXStack_30,
                       (ulong)tempElement._4_4_);
    uVar8 = element.fMemoryManager._4_4_;
    pSStack_e8 = (SchemaElementDecl *)CONCAT44(extraout_var_00,iVar6);
    if (pSStack_e8 == (SchemaElementDecl *)0x0) {
      pXVar1 = (this->super_SGXMLScanner).super_XMLScanner.fURIStringPool;
      iVar6 = (*(((this->super_SGXMLScanner).super_XMLScanner.fGrammar)->super_XSerializable).
                _vptr_XSerializable[6])();
      uVar7 = (*(pXVar1->super_XSerializable)._vptr_XSerializable[9])
                        (pXVar1,CONCAT44(extraout_var_01,iVar6));
      if (uVar8 != uVar7) {
        pXVar14 = XMLScanner::getURIText((XMLScanner *)this,element.fMemoryManager._4_4_);
        switchGrammar(this,pXVar14,tempElement._3_1_);
      }
      pGVar16 = (this->super_SGXMLScanner).super_XMLScanner.fGrammar;
      iVar6 = (*(pGVar16->super_XSerializable)._vptr_XSerializable[0xb])
                        (pGVar16,(ulong)element.fMemoryManager._4_4_,pXVar10,pXStack_30,0xfffffffe);
      pSStack_e8 = (SchemaElementDecl *)CONCAT44(extraout_var_02,iVar6);
      if (pSStack_e8 == (SchemaElementDecl *)0x0) {
        pSStack_e8 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                     getByKey((this->super_SGXMLScanner).fElemNonDeclPool,pXVar10,
                              element.fMemoryManager._4_4_,-2);
        bVar5 = pSStack_e8 == (SchemaElementDecl *)0x0;
        if (bVar5) {
          pSStack_e8 = (SchemaElementDecl *)
                       XMemory::operator_new
                                 (0x80,(this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
          pXVar14 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf)
          ;
          in_stack_fffffffffffffdd8 = (this->super_SGXMLScanner).super_XMLScanner.fMemoryManager;
          SchemaElementDecl::SchemaElementDecl
                    (pSStack_e8,pXVar14,pXVar10,element.fMemoryManager._4_4_,Any,0xfffffffe,
                     in_stack_fffffffffffffdd8);
          this_01 = (this->super_SGXMLScanner).fElemNonDeclPool;
          pXVar10 = XMLElementDecl::getBaseName((XMLElementDecl *)pSStack_e8);
          XVar15 = RefHash3KeysIdPool<xercesc_4_0::SchemaElementDecl,_xercesc_4_0::StringHasher>::
                   put(this_01,pXVar10,element.fMemoryManager._4_4_,-2,pSStack_e8);
          XMLElementDecl::setId((XMLElementDecl *)pSStack_e8,XVar15);
        }
      }
    }
    if ((this->super_SGXMLScanner).super_XMLScanner.fValidator == (XMLValidator *)0x0) {
      local_181 = false;
    }
    else {
      local_181 = SchemaValidator::getIsXsiTypeSet
                            ((SchemaValidator *)
                             (this->super_SGXMLScanner).super_XMLScanner.fValidator);
    }
    if ((bVar5) || (bVar5 = XMLElementDecl::isDeclared(&pSStack_e8->super_XMLElementDecl), !bVar5))
    {
      if ((tempElement._3_1_ != false) && (local_181 == false)) {
        (this->super_SGXMLScanner).super_XMLScanner.fValidate = false;
        ElemStack::setValidationFlag
                  (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,
                   (bool)((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1));
      }
      if ((((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) != 0) &&
         (XMLElementDecl::setCreateReason(&pSStack_e8->super_XMLElementDecl,JustFaultIn),
         local_181 == false)) {
        pXVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
        pXVar10 = XMLElementDecl::getFullName(&pSStack_e8->super_XMLElementDecl);
        XMLValidator::emitError
                  (pXVar2,ElementNotDefined,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    XVar15 = ReaderMgr::getCurrentReaderNum(&(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr)
    ;
    ElemStack::setElement
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,
               &pSStack_e8->super_XMLElementDecl,XVar15);
    ElemStack::setCurrentURI
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,element.fMemoryManager._4_4_)
    ;
    if ((qnameRawBuf._3_1_ & 1) != 0) {
      pXVar10 = XMLString::replicate
                          (pXStack_30,(this->super_SGXMLScanner).super_XMLScanner.fMemoryManager);
      (this->super_SGXMLScanner).super_XMLScanner.fRootElemName = pXVar10;
    }
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) != 0) {
      pXVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
      (*pXVar2->_vptr_XMLValidator[9])(pXVar2,pSStack_e8);
    }
    pXVar10 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf);
    ElemStack::setCurrentSchemaElemName
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,pXVar10);
    if (((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) == 0) {
      local_1b0 = SchemaElementDecl::getComplexTypeInfo(pSStack_e8);
    }
    else {
      local_1b0 = SchemaValidator::getCurrentTypeInfo
                            ((SchemaValidator *)
                             (this->super_SGXMLScanner).super_XMLScanner.fValidator);
    }
    if (local_1b0 != (ComplexTypeInfo *)0x0) {
      tempElement._4_4_ = ComplexTypeInfo::getScopeDefined(local_1b0);
      pXVar10 = ComplexTypeInfo::getTypeName(local_1b0);
      bbPrefix.fMgr._4_4_ = XMLString::indexOf(pXVar10,L',');
      if (0 < bbPrefix.fMgr._4_4_) {
        XMLBufBid::XMLBufBid
                  ((XMLBufBid *)&prefixBuf,&(this->super_SGXMLScanner).super_XMLScanner.fBufMgr);
        failure = (XMLSize_t)XMLBufBid::getBuffer((XMLBufBid *)&prefixBuf);
        XMLBuffer::append((XMLBuffer *)failure,pXVar10,(long)bbPrefix.fMgr._4_4_);
        pXVar10 = XMLBuffer::getRawBuffer((XMLBuffer *)failure);
        switchGrammar(this,pXVar10,tempElement._3_1_);
        XMLBufBid::~XMLBufBid((XMLBufBid *)&prefixBuf);
      }
    }
    ElemStack::setCurrentScope
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,tempElement._4_4_);
    if ((this->super_SGXMLScanner).fElemStateSize <= XVar13) {
      SGXMLScanner::resizeElemState(&this->super_SGXMLScanner);
    }
    (this->super_SGXMLScanner).fElemState[XVar13] = 0;
    (this->super_SGXMLScanner).fElemLoopState[XVar13] = 0;
    ElemStack::setCurrentGrammar
              (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,
               (this->super_SGXMLScanner).super_XMLScanner.fGrammar);
    if (((qnameRawBuf._3_1_ & 1) == 0) && ((element.fMemoryManager._3_1_ & 1) != 0)) {
      child = XMLElementDecl::getElementName(&pSStack_e8->super_XMLElementDecl);
      ElemStack::addChild(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack,child,true);
    }
    XVar11 = SGXMLScanner::buildAttList
                       (&this->super_SGXMLScanner,(this->super_SGXMLScanner).fRawAttrList,XVar11,
                        &pSStack_e8->super_XMLElementDecl,
                        (this->super_SGXMLScanner).super_XMLScanner.fAttrList);
    if (XVar11 != 0) {
      Hash2KeysSetOf<xercesc_4_0::StringHasher>::removeAll
                ((this->super_SGXMLScanner).fUndeclaredAttrRegistry);
    }
    uVar8 = element.fMemoryManager._4_4_;
    if ((this->super_SGXMLScanner).super_XMLScanner.fDocHandler != (XMLDocumentHandler *)0x0) {
      pXVar3 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
      pXVar10 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf);
      (*pXVar3->_vptr_XMLDocumentHandler[0xb])
                (pXVar3,pSStack_e8,(ulong)uVar8,pXVar10,
                 (this->super_SGXMLScanner).super_XMLScanner.fAttrList,XVar11,
                 (ulong)in_stack_fffffffffffffdd8 & 0xffffffff00000000,(uint)(qnameRawBuf._3_1_ & 1)
                );
    }
    if ((attCount._7_1_ & 1) != 0) {
      ElemStack::popTop(&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
      if ((((this->super_SGXMLScanner).super_XMLScanner.fValidate & 1U) != 0) &&
         (pXVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidator,
         uVar8 = (*pXVar2->_vptr_XMLValidator[2])(pXVar2,pSStack_e8,0,0,local_128), (uVar8 & 1) == 0
         )) {
        pXVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
        pXVar10 = XMLElementDecl::getFullName(&pSStack_e8->super_XMLElementDecl);
        iVar6 = (*(pSStack_e8->super_XMLElementDecl).super_XSerializable._vptr_XSerializable[0xd])()
        ;
        XMLValidator::emitError
                  (pXVar2,ElementNotValidForContent,pXVar10,(XMLCh *)CONCAT44(extraout_var_03,iVar6)
                   ,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      bVar4 = qnameRawBuf._3_1_;
      uVar8 = element.fMemoryManager._4_4_;
      if ((this->super_SGXMLScanner).super_XMLScanner.fDocHandler != (XMLDocumentHandler *)0x0) {
        pXVar3 = (this->super_SGXMLScanner).super_XMLScanner.fDocHandler;
        pXVar10 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fPrefixBuf);
        (*pXVar3->_vptr_XMLDocumentHandler[6])
                  (pXVar3,pSStack_e8,(ulong)uVar8,(ulong)(bVar4 & 1),pXVar10);
      }
      if ((qnameRawBuf._3_1_ & 1) == 0) {
        pGVar16 = ElemStack::getCurrentGrammar
                            (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
        (this->super_SGXMLScanner).super_XMLScanner.fGrammar = pGVar16;
        GVar9 = (*(((this->super_SGXMLScanner).super_XMLScanner.fGrammar)->super_XSerializable).
                  _vptr_XSerializable[5])();
        (this->super_SGXMLScanner).fGrammarType = GVar9;
        pXVar2 = (this->super_SGXMLScanner).super_XMLScanner.fValidator;
        (*pXVar2->_vptr_XMLValidator[0xb])
                  (pXVar2,(this->super_SGXMLScanner).super_XMLScanner.fGrammar);
        bVar5 = ElemStack::getValidationFlag
                          (&(this->super_SGXMLScanner).super_XMLScanner.fElemStack);
        (this->super_SGXMLScanner).super_XMLScanner.fValidate = bVar5;
      }
      else {
        *pbStack_20 = false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    bVar5 = XMLBuffer::isEmpty(&(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf);
    if (bVar5) {
      XMLScanner::emitError((XMLScanner *)this,ExpectedElementName);
    }
    else {
      pXVar10 = XMLBuffer::getRawBuffer(&(this->super_SGXMLScanner).super_XMLScanner.fQNameBuf);
      XMLScanner::emitError
                ((XMLScanner *)this,InvalidElementName,pXVar10,(XMLCh *)0x0,(XMLCh *)0x0,
                 (XMLCh *)0x0);
    }
    ReaderMgr::skipToChar(&(this->super_SGXMLScanner).super_XMLScanner.fReaderMgr,L'<');
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool XSAXMLScanner::scanStartTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the root and its empty.
    gotData = true;

    // Reset element content
    fContent.reset();

    //  The current position is after the open bracket, so we need to read in
    //  in the element name.
    int prefixColonPos;
    if (!fReaderMgr.getQName(fQNameBuf, &prefixColonPos))
    {
        if (fQNameBuf.isEmpty())
            emitError(XMLErrs::ExpectedElementName);
        else
            emitError(XMLErrs::InvalidElementName, fQNameBuf.getRawBuffer());
        fReaderMgr.skipToChar(chOpenAngle);
        return false;
    }

    // See if its the root element
    const bool isRoot = fElemStack.isEmpty();

    // Skip any whitespace after the name
    fReaderMgr.skipPastSpaces();

    //  First we have to do the rawest attribute scan. We don't do any
    //  normalization of them at all, since we don't know yet what type they
    //  might be (since we need the element decl in order to do that.)
    const XMLCh* qnameRawBuf = fQNameBuf.getRawBuffer();
    bool isEmpty;
    XMLSize_t attCount = rawAttrScan(qnameRawBuf, *fRawAttrList, isEmpty);

    // save the contentleafname and currentscope before addlevel, for later use
    ContentLeafNameTypeVector* cv = 0;
    XMLContentModel* cm = 0;
    unsigned int currentScope = Grammar::TOP_LEVEL_SCOPE;
    bool laxThisOne = false;
    if (!isRoot)
    {
        // schema validator will have correct type if validating
        SchemaElementDecl* tempElement = (SchemaElementDecl*)
            fElemStack.topElement()->fThisElement;
        SchemaElementDecl::ModelTypes modelType = tempElement->getModelType();
        ComplexTypeInfo *currType = 0;

        if (fValidate)
        {
            currType = ((SchemaValidator*)fValidator)->getCurrentTypeInfo();
            if (currType)
                modelType = (SchemaElementDecl::ModelTypes)currType->getContentType();
            else // something must have gone wrong
                modelType = SchemaElementDecl::Any;
        }
        else {
            currType = tempElement->getComplexTypeInfo();
        }

        if ((modelType == SchemaElementDecl::Mixed_Simple)
          ||  (modelType == SchemaElementDecl::Mixed_Complex)
          ||  (modelType == SchemaElementDecl::Children))
        {
            cm = currType->getContentModel();
            cv = cm->getContentLeafNameTypeVector();
            currentScope = fElemStack.getCurrentScope();
        }
        else if (modelType == SchemaElementDecl::Any) {
            laxThisOne = true;
        }
    }

    //  Now, since we might have to update the namespace map for this element,
    //  but we don't have the element decl yet, we just tell the element stack
    //  to expand up to get ready.
    XMLSize_t elemDepth = fElemStack.addLevel();
    fElemStack.setValidationFlag(fValidate);
    fElemStack.setPrefixColonPos(prefixColonPos);

    //  Make an initial pass through the list and find any xmlns attributes or
    //  schema attributes.
    if (attCount)
        scanRawAttrListforNameSpaces(attCount);

    //  Resolve the qualified name to a URI and name so that we can look up
    //  the element decl for this element. We have now update the prefix to
    //  namespace map so we should get the correct element now.
    unsigned int uriId = resolveQNameWithColon
    (
        qnameRawBuf, fPrefixBuf, ElemStack::Mode_Element, prefixColonPos
    );

    //if schema, check if we should lax or skip the validation of this element
    bool parentValidation = fValidate;
    if (cv) {
        QName element(fPrefixBuf.getRawBuffer(), &qnameRawBuf[prefixColonPos + 1], uriId, fMemoryManager);
        // elementDepth will be > 0, as cv is only constructed if element is not
        // root.
        laxThisOne = laxElementValidation(&element, cv, cm, elemDepth - 1);
    }

    //  Look up the element now in the grammar. This will get us back a
    //  generic element decl object. We tell him to fault one in if he does
    //  not find it.
    bool wasAdded = false;
    const XMLCh* nameRawBuf = &qnameRawBuf[prefixColonPos + 1];
    XMLElementDecl* elemDecl = fGrammar->getElemDecl
    (
        uriId, nameRawBuf, qnameRawBuf, currentScope
    );

    if (!elemDecl)
    {
        // URI is different, so we try to switch grammar
        if (uriId != fURIStringPool->getId(fGrammar->getTargetNamespace())) {
            switchGrammar(getURIText(uriId), laxThisOne);
        }

        // look for a global element declaration
        elemDecl = fGrammar->getElemDecl(
            uriId, nameRawBuf, qnameRawBuf, Grammar::TOP_LEVEL_SCOPE
        );

        if (!elemDecl)
        {
            // if still not found, look in list of undeclared elements
            elemDecl = fElemNonDeclPool->getByKey(
                nameRawBuf, uriId, (int)Grammar::TOP_LEVEL_SCOPE);

            if (!elemDecl)
            {
                elemDecl = new (fMemoryManager) SchemaElementDecl
                (
                    fPrefixBuf.getRawBuffer(), nameRawBuf, uriId
                    , SchemaElementDecl::Any, Grammar::TOP_LEVEL_SCOPE
                    , fMemoryManager
                );

                elemDecl->setId (fElemNonDeclPool->put(
                      (void*)elemDecl->getBaseName(),
                      uriId,
                      (int)Grammar::TOP_LEVEL_SCOPE,
                      (SchemaElementDecl*)elemDecl));

                wasAdded = true;
            }
		}
    }

    //  We do something different here according to whether we found the
    //  element or not.
    bool bXsiTypeSet= (fValidator)?((SchemaValidator*)fValidator)->getIsXsiTypeSet():false;
    if (wasAdded || !elemDecl->isDeclared())
    {
        if (laxThisOne && !bXsiTypeSet) {
            fValidate = false;
            fElemStack.setValidationFlag(fValidate);
        }

        // If validating then emit an error
        if (fValidate)
        {
            // This is to tell the reuse Validator that this element was
            // faulted-in, was not an element in the grammar pool originally
            elemDecl->setCreateReason(XMLElementDecl::JustFaultIn);

            if(!bXsiTypeSet)
                fValidator->emitError
                (
                    XMLValid::ElementNotDefined, elemDecl->getFullName()
                );
        }
    }

    //  Now we can update the element stack to set the current element
    //  decl. We expanded the stack above, but couldn't store the element
    //  decl because we didn't know it yet.
    fElemStack.setElement(elemDecl, fReaderMgr.getCurrentReaderNum());
    fElemStack.setCurrentURI(uriId);

    if (isRoot) {
        fRootElemName = XMLString::replicate(qnameRawBuf, fMemoryManager);
    }

    //  Validate the element
    if (fValidate) {
        fValidator->validateElement(elemDecl);
    }

    // squirrel away the element's QName, so that we can do an efficient
    // end-tag match
    fElemStack.setCurrentSchemaElemName(fQNameBuf.getRawBuffer());

    ComplexTypeInfo* typeinfo = (fValidate)
        ? ((SchemaValidator*)fValidator)->getCurrentTypeInfo()
        : ((SchemaElementDecl*) elemDecl)->getComplexTypeInfo();

    if (typeinfo)
    {
        currentScope = typeinfo->getScopeDefined();

        // switch grammar if the typeinfo has a different grammar
        XMLCh* typeName = typeinfo->getTypeName();
        int comma = XMLString::indexOf(typeName, chComma);
        if (comma > 0)
        {
            XMLBufBid bbPrefix(&fBufMgr);
            XMLBuffer& prefixBuf = bbPrefix.getBuffer();

            prefixBuf.append(typeName, comma);
            switchGrammar(prefixBuf.getRawBuffer(), laxThisOne);
        }
    }
    fElemStack.setCurrentScope(currentScope);

    // Set element next state
    if (elemDepth >= fElemStateSize) {
        resizeElemState();
    }

    fElemState[elemDepth] = 0;
    fElemLoopState[elemDepth] = 0;
    fElemStack.setCurrentGrammar(fGrammar);

    //  If this is the first element and we are validating, check the root
    //  element.
    if (!isRoot && parentValidation) {
        fElemStack.addChild(elemDecl->getElementName(), true);
    }

    //  Now lets get the fAttrList filled in. This involves faulting in any
    //  defaulted and fixed attributes and normalizing the values of any that
    //  we got explicitly.
    //
    //  We update the attCount value with the total number of attributes, but
    //  it goes in with the number of values we got during the raw scan of
    //  explictly provided attrs above.
    attCount = buildAttList(*fRawAttrList, attCount, elemDecl, *fAttrList);

    if(attCount)
    {
        // clean up after ourselves:
        // clear the map used to detect duplicate attributes
        fUndeclaredAttrRegistry->removeAll();
    }

    // Since the element may have default values, call start tag now regardless if it is empty or not
    // If we have a document handler, then tell it about this start tag
    if (fDocHandler)
    {
        fDocHandler->startElement
        (
            *elemDecl, uriId, fPrefixBuf.getRawBuffer(), *fAttrList
            , attCount, false, isRoot
        );
    } // may be where we output something...

    //  If empty, validate content right now if we are validating and then
    //  pop the element stack top. Else, we have to update the current stack
    //  top's namespace mapping elements.
    if (isEmpty)
    {
        // Pop the element stack back off since it'll never be used now
        fElemStack.popTop();

        // If validating, then insure that its legal to have no content
        if (fValidate)
        {
            XMLSize_t failure;
            bool res = fValidator->checkContent(elemDecl, 0, 0, &failure);
            if (!res)
            {
                // REVISIT:  in the case of xsi:type, this may
                // return the wrong string...
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , elemDecl->getFullName()
                    , elemDecl->getFormattedContentModel()
                );
            }
        }

        // If we have a doc handler, tell it about the end tag
        if (fDocHandler)
        {
            fDocHandler->endElement
            (
                *elemDecl, uriId, isRoot, fPrefixBuf.getRawBuffer()
            );
        }

        // If the elem stack is empty, then it was an empty root
        if (isRoot) {
            gotData = false;
        }
        else
        {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            fValidator->setGrammar(fGrammar);

            // Restore the validation flag
            fValidate = fElemStack.getValidationFlag();
        }
    }

    return true;
}